

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Scale_x86_avx2::forward_inplace
          (Scale_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  float fVar5;
  Mat *this_00;
  void *pvVar6;
  long lVar7;
  _func_int **pp_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float *scale_ptr;
  Mat local_78;
  undefined1 auVar31 [32];
  undefined1 auVar35 [32];
  
  this_00 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar21 = this_00->dims;
  if (this_00->elempack == 4) {
    if (iVar21 == 3) {
      uVar25 = this_00->h * this_00->w;
      uVar22 = this_00->c;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx2[-3]) == 0) {
        uVar27 = 0;
        uVar24 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          Mat::channel(&local_78,this_00,(int)uVar27);
          pauVar28 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          pfVar1 = (float *)((long)this_00[1].data + uVar27 * 0x10);
          fVar5 = *pfVar1;
          fVar9 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar34._0_4_ = fVar5 * *(float *)*pauVar28;
            auVar34._4_4_ = fVar9 * *(float *)(*pauVar28 + 4);
            auVar34._8_4_ = fVar10 * *(float *)(*pauVar28 + 8);
            auVar34._12_4_ = fVar11 * *(float *)(*pauVar28 + 0xc);
            *(undefined1 (*) [16])*pauVar28 = auVar34;
            pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
          }
        }
      }
      else {
        uVar27 = 0;
        uVar24 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          Mat::channel(&local_78,this_00,(int)uVar27);
          pauVar28 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          auVar34 = *(undefined1 (*) [16])((long)this_00[1].data + uVar27 * 0x10);
          auVar33 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx2[-3]) +
                     uVar27 * 0x10);
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar30 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar28,auVar33,auVar34);
            *(undefined1 (*) [16])*pauVar28 = auVar30;
            pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
          }
        }
      }
    }
    else if (iVar21 == 2) {
      pp_Var8 = this->_vptr_Scale_x86_avx2;
      uVar22 = this_00->w;
      uVar25 = this_00->h;
      if (*(int *)(&this->field_0xd4 + (long)pp_Var8[-3]) == 0) {
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          pauVar29 = (undefined1 (*) [16])
                     ((long)this_00->w * uVar27 * this_00->elemsize + (long)this_00->data);
          pfVar1 = (float *)((long)this_00[1].data + uVar27 * 0x10);
          fVar5 = *pfVar1;
          fVar9 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar33._0_4_ = fVar5 * *(float *)*pauVar29;
            auVar33._4_4_ = fVar9 * *(float *)((long)*pauVar29 + 4);
            auVar33._8_4_ = fVar10 * *(float *)((long)*pauVar29 + 8);
            auVar33._12_4_ = fVar11 * *(float *)((long)*pauVar29 + 0xc);
            *pauVar29 = auVar33;
            pauVar29 = pauVar29 + 1;
          }
        }
      }
      else {
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          pauVar29 = (undefined1 (*) [16])
                     ((long)this_00->w * uVar27 * this_00->elemsize + (long)this_00->data);
          auVar34 = *(undefined1 (*) [16])((long)this_00[1].data + uVar27 * 0x10);
          auVar33 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x120 + (long)pp_Var8[-3]) + uVar27 * 0x10);
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar30 = vfmadd132ps_fma(*pauVar29,auVar33,auVar34);
            *pauVar29 = auVar30;
            pauVar29 = pauVar29 + 1;
          }
        }
      }
    }
    else if (iVar21 == 1) {
      uVar22 = this_00->w;
      pvVar6 = this_00[1].data;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx2[-3]) == 0) {
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        for (; uVar24 * 0x10 != uVar27; uVar27 = uVar27 + 0x10) {
          pfVar1 = (float *)((long)pvVar6 + uVar27);
          fVar5 = pfVar1[1];
          fVar9 = pfVar1[2];
          fVar10 = pfVar1[3];
          pfVar2 = (float *)((long)this_00->data + uVar27);
          fVar11 = pfVar2[1];
          fVar12 = pfVar2[2];
          fVar13 = pfVar2[3];
          pfVar3 = (float *)((long)this_00->data + uVar27);
          *pfVar3 = *pfVar1 * *pfVar2;
          pfVar3[1] = fVar5 * fVar11;
          pfVar3[2] = fVar9 * fVar12;
          pfVar3[3] = fVar10 * fVar13;
        }
      }
      else {
        lVar7 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx2[-3]);
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        for (; uVar24 * 0x10 != uVar27; uVar27 = uVar27 + 0x10) {
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar6 + uVar27),
                                    *(undefined1 (*) [16])((long)this_00->data + uVar27),
                                    *(undefined1 (*) [16])(lVar7 + uVar27));
          *(undefined1 (*) [16])((long)this_00->data + uVar27) = auVar34;
        }
      }
    }
  }
  else if (this_00->elempack == 8) {
    if (iVar21 == 3) {
      uVar25 = this_00->h * this_00->w;
      uVar22 = this_00->c;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx2[-3]) == 0) {
        uVar27 = 0;
        uVar24 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          Mat::channel(&local_78,this_00,(int)uVar27);
          pauVar28 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          pfVar1 = (float *)((long)this_00[1].data + uVar27 * 0x20);
          fVar5 = *pfVar1;
          fVar9 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          fVar12 = pfVar1[4];
          fVar13 = pfVar1[5];
          fVar14 = pfVar1[6];
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar38._0_4_ = fVar5 * *(float *)*pauVar28;
            auVar38._4_4_ = fVar9 * *(float *)(*pauVar28 + 4);
            auVar38._8_4_ = fVar10 * *(float *)(*pauVar28 + 8);
            auVar38._12_4_ = fVar11 * *(float *)(*pauVar28 + 0xc);
            auVar38._16_4_ = fVar12 * *(float *)(*pauVar28 + 0x10);
            auVar38._20_4_ = fVar13 * *(float *)(*pauVar28 + 0x14);
            auVar38._28_36_ = in_ZMM1._28_36_;
            auVar38._24_4_ = fVar14 * *(float *)(*pauVar28 + 0x18);
            in_ZMM1 = ZEXT3264(auVar38._0_32_);
            *pauVar28 = auVar38._0_32_;
            pauVar28 = pauVar28 + 1;
          }
        }
      }
      else {
        uVar27 = 0;
        uVar24 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          Mat::channel(&local_78,this_00,(int)uVar27);
          pauVar28 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          auVar31 = *(undefined1 (*) [32])((long)this_00[1].data + uVar27 * 0x20);
          auVar35 = *(undefined1 (*) [32])
                     (*(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx2[-3]) +
                     uVar27 * 0x20);
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar34 = vfmadd132ps_fma(*pauVar28,auVar35,auVar31);
            *pauVar28 = ZEXT1632(auVar34);
            pauVar28 = pauVar28 + 1;
          }
        }
      }
    }
    else if (iVar21 == 2) {
      pp_Var8 = this->_vptr_Scale_x86_avx2;
      uVar22 = this_00->w;
      uVar25 = this_00->h;
      if (*(int *)(&this->field_0xd4 + (long)pp_Var8[-3]) == 0) {
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          pauVar28 = (undefined1 (*) [32])
                     ((long)this_00->w * uVar27 * this_00->elemsize + (long)this_00->data);
          pfVar1 = (float *)((long)this_00[1].data + uVar27 * 0x20);
          fVar5 = *pfVar1;
          fVar9 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          fVar12 = pfVar1[4];
          fVar13 = pfVar1[5];
          fVar14 = pfVar1[6];
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar37._0_4_ = fVar5 * *(float *)*pauVar28;
            auVar37._4_4_ = fVar9 * *(float *)((long)*pauVar28 + 4);
            auVar37._8_4_ = fVar10 * *(float *)((long)*pauVar28 + 8);
            auVar37._12_4_ = fVar11 * *(float *)((long)*pauVar28 + 0xc);
            auVar37._16_4_ = fVar12 * *(float *)((long)*pauVar28 + 0x10);
            auVar37._20_4_ = fVar13 * *(float *)((long)*pauVar28 + 0x14);
            auVar37._28_36_ = in_ZMM1._28_36_;
            auVar37._24_4_ = fVar14 * *(float *)((long)*pauVar28 + 0x18);
            in_ZMM1 = ZEXT3264(auVar37._0_32_);
            *pauVar28 = auVar37._0_32_;
            pauVar28 = pauVar28 + 1;
          }
        }
      }
      else {
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        uVar26 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          pauVar28 = (undefined1 (*) [32])
                     ((long)this_00->w * uVar27 * this_00->elemsize + (long)this_00->data);
          auVar31 = *(undefined1 (*) [32])((long)this_00[1].data + uVar27 * 0x20);
          auVar35 = *(undefined1 (*) [32])
                     (*(long *)(&this->field_0x120 + (long)pp_Var8[-3]) + uVar27 * 0x20);
          uVar23 = uVar24;
          while (iVar21 = (int)uVar23, uVar23 = (ulong)(iVar21 - 1), iVar21 != 0) {
            auVar34 = vfmadd132ps_fma(*pauVar28,auVar35,auVar31);
            *pauVar28 = ZEXT1632(auVar34);
            pauVar28 = pauVar28 + 1;
          }
        }
      }
    }
    else if (iVar21 == 1) {
      uVar22 = this_00->w;
      pvVar6 = this_00[1].data;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx2[-3]) == 0) {
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        for (; uVar24 * 0x20 != uVar27; uVar27 = uVar27 + 0x20) {
          pfVar1 = (float *)((long)pvVar6 + uVar27);
          fVar5 = pfVar1[1];
          fVar9 = pfVar1[2];
          fVar10 = pfVar1[3];
          fVar11 = pfVar1[4];
          fVar12 = pfVar1[5];
          fVar13 = pfVar1[6];
          fVar14 = pfVar1[7];
          pfVar2 = (float *)((long)this_00->data + uVar27);
          fVar15 = pfVar2[1];
          fVar16 = pfVar2[2];
          fVar17 = pfVar2[3];
          fVar18 = pfVar2[4];
          fVar19 = pfVar2[5];
          fVar20 = pfVar2[6];
          pfVar3 = (float *)((long)this_00->data + uVar27);
          *pfVar3 = *pfVar1 * *pfVar2;
          pfVar3[1] = fVar5 * fVar15;
          pfVar3[2] = fVar9 * fVar16;
          pfVar3[3] = fVar10 * fVar17;
          pfVar3[4] = fVar11 * fVar18;
          pfVar3[5] = fVar12 * fVar19;
          pfVar3[6] = fVar13 * fVar20;
          pfVar3[7] = fVar14;
        }
      }
      else {
        lVar7 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx2[-3]);
        uVar27 = 0;
        uVar24 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar24 = uVar27;
        }
        for (; uVar24 * 0x20 != uVar27; uVar27 = uVar27 + 0x20) {
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar6 + uVar27),
                                    *(undefined1 (*) [32])((long)this_00->data + uVar27),
                                    *(undefined1 (*) [32])(lVar7 + uVar27));
          *(undefined1 (*) [32])((long)this_00->data + uVar27) = ZEXT1632(auVar34);
        }
      }
    }
  }
  else {
    if (iVar21 != 3) {
      iVar21 = Scale::forward_inplace
                         ((Scale *)((long)&this->_vptr_Scale_x86_avx2 +
                                   (long)this->_vptr_Scale_x86_avx2[-3]),bottom_top_blobs,opt);
      return iVar21;
    }
    uVar22 = this_00->c;
    uVar25 = this_00->h * this_00->w;
    pvVar6 = this_00[1].data;
    if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx2[-3]) == 0) {
      uVar27 = 0;
      uVar24 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar24 = uVar27;
      }
      for (; uVar27 != uVar24; uVar27 = uVar27 + 1) {
        in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
        Mat::channel(&local_78,this_00,(int)uVar27);
        pauVar28 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        fVar5 = *(float *)((long)pvVar6 + uVar27 * 4);
        for (iVar21 = (int)uVar25 >> 3; uVar22 = uVar25 & 7, 0 < iVar21; iVar21 = iVar21 + -1) {
          auVar36._0_4_ = fVar5 * *(float *)*pauVar28;
          auVar36._4_4_ = fVar5 * *(float *)(*pauVar28 + 4);
          auVar36._8_4_ = fVar5 * *(float *)(*pauVar28 + 8);
          auVar36._12_4_ = fVar5 * *(float *)(*pauVar28 + 0xc);
          auVar36._16_4_ = fVar5 * *(float *)(*pauVar28 + 0x10);
          auVar36._20_4_ = fVar5 * *(float *)(*pauVar28 + 0x14);
          auVar36._28_36_ = in_ZMM1._28_36_;
          auVar36._24_4_ = fVar5 * *(float *)(*pauVar28 + 0x18);
          in_ZMM1 = ZEXT3264(auVar36._0_32_);
          *pauVar28 = auVar36._0_32_;
          pauVar28 = pauVar28 + 1;
        }
        for (; 0 < (int)uVar22; uVar22 = uVar22 - 1) {
          fVar9 = fVar5 * *(float *)*pauVar28;
          in_ZMM1 = ZEXT464((uint)fVar9);
          *(float *)*pauVar28 = fVar9;
          pauVar28 = (undefined1 (*) [32])(*pauVar28 + 4);
        }
      }
    }
    else {
      lVar7 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx2[-3]);
      uVar27 = 0;
      uVar24 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar24 = uVar27;
      }
      for (; uVar27 != uVar24; uVar27 = uVar27 + 1) {
        Mat::channel(&local_78,this_00,(int)uVar27);
        pauVar28 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        uVar4 = *(undefined4 *)((long)pvVar6 + uVar27 * 4);
        auVar30._4_4_ = uVar4;
        auVar30._0_4_ = uVar4;
        auVar30._8_4_ = uVar4;
        auVar30._12_4_ = uVar4;
        auVar31._16_4_ = uVar4;
        auVar31._0_16_ = auVar30;
        auVar31._20_4_ = uVar4;
        auVar31._24_4_ = uVar4;
        auVar31._28_4_ = uVar4;
        uVar4 = *(undefined4 *)(lVar7 + uVar27 * 4);
        auVar32._4_4_ = uVar4;
        auVar32._0_4_ = uVar4;
        auVar32._8_4_ = uVar4;
        auVar32._12_4_ = uVar4;
        auVar35._16_4_ = uVar4;
        auVar35._0_16_ = auVar32;
        auVar35._20_4_ = uVar4;
        auVar35._24_4_ = uVar4;
        auVar35._28_4_ = uVar4;
        for (iVar21 = (int)uVar25 >> 3; uVar22 = uVar25 & 7, 0 < iVar21; iVar21 = iVar21 + -1) {
          auVar34 = vfmadd132ps_fma(*pauVar28,auVar35,auVar31);
          *pauVar28 = ZEXT1632(auVar34);
          pauVar28 = pauVar28 + 1;
        }
        for (; 0 < (int)uVar22; uVar22 = uVar22 - 1) {
          auVar34 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar28),auVar32,auVar30);
          *(int *)*pauVar28 = auVar34._0_4_;
          pauVar28 = (undefined1 (*) [32])(*pauVar28 + 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86_avx2::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                    _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    _p = _mm256_mul_ps(_p, _s);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    __m128 _bias = _mm_loadu_ps(bias + i * 4);
                    _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                    _mm_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    _p = _mm_mul_ps(_p, _s);
                    _mm_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return Scale::forward_inplace(bottom_top_blobs, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (bias_term)
    {
        const float* scale_ptr = scale_blob;
        const float* bias_ptr = bias_data;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];
            float bias = bias_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            __m256 _bias = _mm256_set1_ps(bias);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr = *ptr * s + bias;

                ptr++;
            }
        }
    }
    else
    {
        const float* scale_ptr = scale_blob;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _s);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr *= s;

                ptr++;
            }
        }
    }

    return 0;
}